

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O0

void __thiscall jaegertracing::Span::SetOperationName(Span *this,string_view name)

{
  bool bVar1;
  string local_50;
  uint local_2c;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  Span *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.length_;
  this_local = (Span *)name.data_;
  lock._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_28,(mutex_type *)(this + 0x148));
  bVar1 = isFinished(this);
  if (!bVar1) {
    opentracing::v3::string_view::operator_cast_to_string(&local_50,(string_view *)&this_local);
    std::__cxx11::string::operator=((string *)(this + 200),(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_2c = (uint)bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void SetOperationName(opentracing::string_view name) noexcept override
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (isFinished()) {
            return;
        }
        _operationName = name;
    }